

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode * __thiscall JSONNode::operator[](JSONNode *this,json_index_t pos)

{
  JSONNode *pJVar1;
  json_index_t pos_local;
  JSONNode *this_local;
  
  makeUniqueInternal(this);
  pJVar1 = internalJSONNode::at(this->internal,pos);
  return pJVar1;
}

Assistant:

JSONNode & JSONNode::operator[](json_index_t pos) json_nothrow {
    JSON_CHECK_INTERNAL();
    JSON_ASSERT(pos < internal -> size(), JSON_TEXT("[] out of bounds"));
    makeUniqueInternal();
    return *(internal -> at(pos));
}